

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O1

int run_test_semaphore_1(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar2;
  long *plVar3;
  long *plVar4;
  uv_connect_t *puVar5;
  uv_shutdown_t *puVar6;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_thread_t thread;
  worker_config_conflict1 wc;
  void *pvStack_370;
  uv_shutdown_t auStack_368 [2];
  code *pcStack_278;
  code *pcStack_268;
  code *pcStack_260;
  uv_connect_t auStack_250 [2];
  code *pcStack_158;
  long lStack_150;
  long lStack_148;
  long alStack_140 [4];
  code *pcStack_120;
  long lStack_110;
  long alStack_108 [12];
  code *pcStack_a8;
  undefined8 uStack_a0;
  long lStack_98;
  code *pcStack_90;
  long local_80;
  long local_78;
  long local_70 [10];
  undefined8 uStack_20;
  int iStack_1c;
  
  plVar3 = local_70 + 6;
  local_70[9] = 0;
  uStack_20 = 0;
  local_70[7] = 0;
  local_70[8] = 0;
  local_70[5] = 0;
  local_70[6] = 0;
  local_70[3] = 0;
  local_70[4] = 0;
  local_70[1] = 0;
  local_70[2] = 0;
  pcStack_90 = (code *)0x1ba461;
  iVar1 = uv_sem_init(plVar3,0);
  local_70[0] = (long)iVar1;
  local_80 = 0;
  if (local_70[0] == 0) {
    pcStack_90 = (code *)0x1ba48b;
    iVar1 = uv_mutex_init(local_70 + 1);
    local_70[0] = (long)iVar1;
    local_80 = 0;
    if (local_70[0] != 0) goto LAB_001ba57d;
    pcStack_90 = (code *)0x1ba4c1;
    iVar1 = uv_thread_create(local_70,worker,local_70 + 1);
    local_80 = (long)iVar1;
    local_78 = 0;
    if (local_80 != 0) goto LAB_001ba58c;
    pcStack_90 = (code *)0x1ba4eb;
    uv_sleep(100);
    pcStack_90 = (code *)0x1ba4f8;
    uv_mutex_lock(local_70 + 1);
    local_80 = 1;
    local_78 = (long)iStack_1c;
    if (local_78 != 1) goto LAB_001ba59b;
    pcStack_90 = (code *)0x1ba522;
    uv_sem_wait(plVar3);
    pcStack_90 = (code *)0x1ba52c;
    uv_mutex_unlock(local_70 + 1);
    pcStack_90 = (code *)0x1ba536;
    iVar1 = uv_thread_join(local_70);
    local_80 = (long)iVar1;
    local_78 = 0;
    if (local_80 == 0) {
      pcStack_90 = (code *)0x1ba55c;
      uv_mutex_destroy(local_70 + 1);
      pcStack_90 = (code *)0x1ba564;
      uv_sem_destroy(plVar3);
      return 0;
    }
  }
  else {
    pcStack_90 = (code *)0x1ba57d;
    run_test_semaphore_1_cold_1();
LAB_001ba57d:
    pcStack_90 = (code *)0x1ba58c;
    run_test_semaphore_1_cold_2();
LAB_001ba58c:
    pcStack_90 = (code *)0x1ba59b;
    run_test_semaphore_1_cold_3();
LAB_001ba59b:
    pcStack_90 = (code *)0x1ba5aa;
    run_test_semaphore_1_cold_4();
  }
  plVar4 = &local_80;
  pcStack_90 = worker;
  run_test_semaphore_1_cold_5();
  pcStack_90 = (code *)plVar3;
  if ((int)plVar4[9] != 0) {
    pcStack_a8 = (code *)0x1ba5cd;
    uv_sleep();
  }
  pcStack_a8 = (code *)0x1ba5d5;
  uv_mutex_lock(plVar4);
  lStack_98 = (long)*(int *)((long)plVar4 + 0x4c);
  uStack_a0 = 0;
  if (lStack_98 == 0) {
    pcStack_a8 = (code *)0x1ba5fa;
    uv_sem_post(plVar4 + 5);
    *(undefined4 *)((long)plVar4 + 0x4c) = 1;
    iVar1 = uv_mutex_unlock(plVar4);
    return iVar1;
  }
  pcStack_a8 = run_test_semaphore_2;
  worker_cold_1();
  plVar3 = alStack_108 + 7;
  alStack_108[10] = 0;
  alStack_108[8] = 0;
  alStack_108[9] = 0;
  alStack_108[6] = 0;
  alStack_108[7] = 0;
  alStack_108[4] = 0;
  alStack_108[5] = 0;
  alStack_108[2] = 0;
  alStack_108[3] = 0;
  alStack_108[0xb] = 100;
  pcStack_120 = (code *)0x1ba64d;
  pcStack_a8 = (code *)plVar4;
  iVar1 = uv_sem_init(plVar3,0);
  alStack_108[0] = (long)iVar1;
  lStack_110 = 0;
  if (alStack_108[0] == 0) {
    pcStack_120 = (code *)0x1ba677;
    iVar1 = uv_mutex_init(alStack_108 + 2);
    alStack_108[0] = (long)iVar1;
    lStack_110 = 0;
    if (alStack_108[0] != 0) goto LAB_001ba720;
    pcStack_120 = (code *)0x1ba6ad;
    iVar1 = uv_thread_create(alStack_108,worker,alStack_108 + 2);
    lStack_110 = (long)iVar1;
    alStack_108[1] = 0;
    if (lStack_110 != 0) goto LAB_001ba72f;
    pcStack_120 = (code *)0x1ba6d1;
    uv_sem_wait(plVar3);
    pcStack_120 = (code *)0x1ba6db;
    iVar1 = uv_thread_join(alStack_108);
    lStack_110 = (long)iVar1;
    alStack_108[1] = 0;
    if (lStack_110 == 0) {
      pcStack_120 = (code *)0x1ba701;
      uv_mutex_destroy(alStack_108 + 2);
      pcStack_120 = (code *)0x1ba709;
      uv_sem_destroy(plVar3);
      return 0;
    }
  }
  else {
    pcStack_120 = (code *)0x1ba720;
    run_test_semaphore_2_cold_1();
LAB_001ba720:
    pcStack_120 = (code *)0x1ba72f;
    run_test_semaphore_2_cold_2();
LAB_001ba72f:
    pcStack_120 = (code *)0x1ba73e;
    run_test_semaphore_2_cold_3();
  }
  pcStack_120 = run_test_semaphore_3;
  run_test_semaphore_2_cold_4();
  pcStack_158 = (code *)0x1ba761;
  pcStack_120 = (code *)plVar3;
  iVar1 = uv_sem_init(alStack_140,3);
  lStack_148 = (long)iVar1;
  lStack_150 = 0;
  if (lStack_148 == 0) {
    plVar3 = alStack_140;
    pcStack_158 = (code *)0x1ba78c;
    uv_sem_wait(plVar3);
    pcStack_158 = (code *)0x1ba794;
    uv_sem_wait(plVar3);
    pcStack_158 = (code *)0x1ba79c;
    iVar1 = uv_sem_trywait(plVar3);
    lStack_148 = (long)iVar1;
    lStack_150 = 0;
    if (lStack_148 != 0) goto LAB_001ba850;
    lStack_148 = -0xb;
    pcStack_158 = (code *)0x1ba7cd;
    iVar1 = uv_sem_trywait(alStack_140);
    lStack_150 = (long)iVar1;
    if (lStack_148 != lStack_150) goto LAB_001ba85d;
    plVar3 = alStack_140;
    pcStack_158 = (code *)0x1ba7eb;
    uv_sem_post(plVar3);
    pcStack_158 = (code *)0x1ba7f3;
    iVar1 = uv_sem_trywait(plVar3);
    lStack_148 = (long)iVar1;
    lStack_150 = 0;
    if (lStack_148 != 0) goto LAB_001ba86a;
    lStack_148 = -0xb;
    pcStack_158 = (code *)0x1ba820;
    iVar1 = uv_sem_trywait(alStack_140);
    lStack_150 = (long)iVar1;
    if (lStack_148 == lStack_150) {
      pcStack_158 = (code *)0x1ba83b;
      uv_sem_destroy(alStack_140);
      return 0;
    }
  }
  else {
    pcStack_158 = (code *)0x1ba850;
    run_test_semaphore_3_cold_1();
LAB_001ba850:
    pcStack_158 = (code *)0x1ba85d;
    run_test_semaphore_3_cold_2();
LAB_001ba85d:
    pcStack_158 = (code *)0x1ba86a;
    run_test_semaphore_3_cold_3();
LAB_001ba86a:
    pcStack_158 = (code *)0x1ba877;
    run_test_semaphore_3_cold_4();
  }
  pcStack_158 = run_test_shutdown_close_tcp;
  run_test_semaphore_3_cold_5();
  pcStack_260 = (code *)0x1ba8a2;
  pcStack_158 = (code *)plVar3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&auStack_250[0].type);
  auStack_250[0].reserved[1] = (void *)(long)iVar1;
  auStack_250[0].data = (uv_loop_t *)0x0;
  if (auStack_250[0].reserved[1] == (void *)0x0) {
    pcStack_260 = (code *)0x1ba8c7;
    uVar2 = uv_default_loop();
    pcStack_260 = (code *)0x1ba8d4;
    iVar1 = uv_tcp_init(uVar2,auStack_250[0].reserved + 1);
    auStack_250[0].data = (void *)(long)iVar1;
    auStack_250[0].loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_250[0].data != (uv_loop_t *)0x0) goto LAB_001baa3a;
    pcStack_260 = (code *)0x1ba911;
    iVar1 = uv_tcp_connect(&connect_req,auStack_250[0].reserved + 1,&auStack_250[0].type,connect_cb)
    ;
    auStack_250[0].data = (void *)(long)iVar1;
    auStack_250[0].loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_250[0].data != (uv_loop_t *)0x0) goto LAB_001baa49;
    pcStack_260 = (code *)0x1ba936;
    uVar2 = uv_default_loop();
    pcStack_260 = (code *)0x1ba940;
    iVar1 = uv_run(uVar2,0);
    auStack_250[0].data = (void *)(long)iVar1;
    auStack_250[0].loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_250[0].data != (uv_loop_t *)0x0) goto LAB_001baa58;
    auStack_250[0].data = (uv_loop_t *)0x1;
    auStack_250[0].loop = (uv_loop_t *)(long)connect_cb_called;
    if (auStack_250[0].loop != (uv_loop_t *)0x1) goto LAB_001baa67;
    auStack_250[0].data = (uv_loop_t *)0x1;
    auStack_250[0].loop = (uv_loop_t *)(long)shutdown_cb_called;
    if (auStack_250[0].loop != (uv_loop_t *)0x1) goto LAB_001baa76;
    auStack_250[0].data = (uv_loop_t *)0x1;
    auStack_250[0].loop = (uv_loop_t *)(long)close_cb_called;
    if (auStack_250[0].loop != (uv_loop_t *)0x1) goto LAB_001baa85;
    pcStack_260 = (code *)0x1ba9d4;
    plVar3 = (long *)uv_default_loop();
    pcStack_260 = (code *)0x1ba9e8;
    uv_walk(plVar3,close_walk_cb,0);
    pcStack_260 = (code *)0x1ba9f2;
    uv_run(plVar3,0);
    auStack_250[0].data = (uv_loop_t *)0x0;
    pcStack_260 = (code *)0x1baa00;
    uVar2 = uv_default_loop();
    pcStack_260 = (code *)0x1baa08;
    iVar1 = uv_loop_close(uVar2);
    auStack_250[0].loop = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)auStack_250[0].data == auStack_250[0].loop) {
      pcStack_260 = (code *)0x1baa20;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_260 = (code *)0x1baa3a;
    run_test_shutdown_close_tcp_cold_1();
LAB_001baa3a:
    pcStack_260 = (code *)0x1baa49;
    run_test_shutdown_close_tcp_cold_2();
LAB_001baa49:
    pcStack_260 = (code *)0x1baa58;
    run_test_shutdown_close_tcp_cold_3();
LAB_001baa58:
    pcStack_260 = (code *)0x1baa67;
    run_test_shutdown_close_tcp_cold_4();
LAB_001baa67:
    pcStack_260 = (code *)0x1baa76;
    run_test_shutdown_close_tcp_cold_5();
LAB_001baa76:
    pcStack_260 = (code *)0x1baa85;
    run_test_shutdown_close_tcp_cold_6();
LAB_001baa85:
    pcStack_260 = (code *)0x1baa94;
    run_test_shutdown_close_tcp_cold_7();
  }
  puVar5 = auStack_250;
  iVar1 = (int)auStack_250 + 8;
  pcStack_260 = connect_cb;
  run_test_shutdown_close_tcp_cold_8();
  if (puVar5 == &connect_req) {
    pcStack_260 = (code *)(long)iVar1;
    pcStack_268 = (code *)0x0;
    if (pcStack_260 != (code *)0x0) goto LAB_001bab85;
    pcStack_278 = (code *)0x1baaf2;
    iVar1 = uv_shutdown(&shutdown_req,connect_req.handle,shutdown_cb);
    pcStack_260 = (code *)(long)iVar1;
    pcStack_268 = (code *)0x0;
    if (pcStack_260 != (code *)0x0) goto LAB_001bab94;
    pcStack_278 = (code *)0x1bab1e;
    iVar1 = uv_is_closing(connect_req.handle);
    pcStack_260 = (code *)(long)iVar1;
    pcStack_268 = (code *)0x0;
    if (pcStack_260 != (code *)0x0) goto LAB_001baba3;
    pcStack_278 = (code *)0x1bab4d;
    uv_close(connect_req.handle,close_cb);
    pcStack_260 = (code *)0x1;
    pcStack_278 = (code *)0x1bab62;
    iVar1 = uv_is_closing(connect_req.handle);
    pcStack_268 = (code *)(long)iVar1;
    if (pcStack_260 == pcStack_268) {
      connect_cb_called = connect_cb_called + 1;
      return (int)pcStack_260;
    }
  }
  else {
    pcStack_278 = (code *)0x1bab85;
    connect_cb_cold_1();
LAB_001bab85:
    pcStack_278 = (code *)0x1bab94;
    connect_cb_cold_2();
LAB_001bab94:
    pcStack_278 = (code *)0x1baba3;
    connect_cb_cold_3();
LAB_001baba3:
    pcStack_278 = (code *)0x1babb2;
    connect_cb_cold_4();
  }
  pcStack_278 = run_test_shutdown_close_pipe;
  connect_cb_cold_5();
  pcStack_278 = (code *)plVar3;
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&auStack_368[0].loop,0);
  auStack_368[0].data = (void *)(long)iVar1;
  pvStack_370 = (void *)0x0;
  if (auStack_368[0].data == (void *)0x0) {
    uv_pipe_connect(&connect_req,&auStack_368[0].loop,"/tmp/uv-test-sock",connect_cb);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    auStack_368[0].data = (void *)(long)iVar1;
    pvStack_370 = (void *)0x0;
    if (auStack_368[0].data != (void *)0x0) goto LAB_001bad25;
    auStack_368[0].data = (void *)0x1;
    pvStack_370 = (void *)(long)connect_cb_called;
    if (pvStack_370 != (void *)0x1) goto LAB_001bad34;
    auStack_368[0].data = (void *)0x1;
    pvStack_370 = (void *)(long)shutdown_cb_called;
    if (pvStack_370 != (void *)0x1) goto LAB_001bad43;
    auStack_368[0].data = (void *)0x1;
    pvStack_370 = (void *)(long)close_cb_called;
    if (pvStack_370 == (void *)0x1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      auStack_368[0].data = (void *)0x0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      pvStack_370 = (void *)(long)iVar1;
      if (auStack_368[0].data == pvStack_370) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001bad61;
    }
  }
  else {
    run_test_shutdown_close_pipe_cold_1();
LAB_001bad25:
    run_test_shutdown_close_pipe_cold_2();
LAB_001bad34:
    run_test_shutdown_close_pipe_cold_3();
LAB_001bad43:
    run_test_shutdown_close_pipe_cold_4();
  }
  run_test_shutdown_close_pipe_cold_5();
LAB_001bad61:
  puVar6 = auStack_368;
  iVar1 = (int)&pvStack_370;
  run_test_shutdown_close_pipe_cold_6();
  if (puVar6 == &shutdown_req) {
    if ((iVar1 == -0x7d) || (iVar1 == 0)) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return extraout_EAX;
    }
  }
  else {
    shutdown_cb_cold_1();
  }
  shutdown_cb_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(semaphore_1) {
  uv_thread_t thread;
  worker_config wc;

  memset(&wc, 0, sizeof(wc));

  ASSERT_OK(uv_sem_init(&wc.sem, 0));
  ASSERT_OK(uv_mutex_init(&wc.mutex));
  ASSERT_OK(uv_thread_create(&thread, worker, &wc));

  uv_sleep(100);
  uv_mutex_lock(&wc.mutex);
  ASSERT_EQ(1, wc.posted);
  uv_sem_wait(&wc.sem); /* should not block */
  uv_mutex_unlock(&wc.mutex); /* ergo, it should be ok to unlock after wait */

  ASSERT_OK(uv_thread_join(&thread));
  uv_mutex_destroy(&wc.mutex);
  uv_sem_destroy(&wc.sem);

  return 0;
}